

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

BBox * __thiscall CS248::DynamicScene::Mesh::getBBox(BBox *__return_storage_ptr__,Mesh *this)

{
  undefined8 uVar1;
  pointer pVVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  Vector4D posObjWorld;
  undefined1 local_f8 [16];
  double local_e8;
  double local_e0;
  Vector4D local_d0;
  Vector3D local_b0 [5];
  
  (__return_storage_ptr__->max).x = -INFINITY;
  (__return_storage_ptr__->max).y = -INFINITY;
  (__return_storage_ptr__->max).z = -INFINITY;
  (__return_storage_ptr__->min).x = INFINITY;
  (__return_storage_ptr__->min).y = INFINITY;
  (__return_storage_ptr__->min).z = INFINITY;
  (__return_storage_ptr__->extent).x = -INFINITY;
  (__return_storage_ptr__->extent).y = -INFINITY;
  (__return_storage_ptr__->extent).z = -INFINITY;
  if (0 < this->numTriangles_) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      pVVar2 = (this->positionData_).
               super__Vector_base<CS248::DynamicScene::Vector3Df,_std::allocator<CS248::DynamicScene::Vector3Df>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_e8 = (double)*(float *)((long)&pVVar2->x + lVar4);
      uVar1 = *(undefined8 *)((long)pVVar2 + lVar4 + -8);
      dVar3 = (double)(float)((ulong)uVar1 >> 0x20);
      local_f8._8_4_ = SUB84(dVar3,0);
      local_f8._0_8_ = (double)(float)uVar1;
      local_f8._12_4_ = (int)((ulong)dVar3 >> 0x20);
      local_e0 = 1.0;
      SceneObject::getObjectToWorld((Matrix4x4 *)local_b0,&this->super_SceneObject);
      Matrix4x4::operator*((Matrix4x4 *)local_b0,(Vector4D *)local_f8);
      Vector4D::projectTo3D(&local_d0);
      BBox::expand(__return_storage_ptr__,local_b0);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar5 < (long)this->numTriangles_ * 3);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Mesh::getBBox() const {

	BBox bbox;

	// convert object-space points to world space points, and compute a world-space bounding box
	// NOTE(kayvonf): this is an inefficient implementation since we're considering each unique vertex position up to 3 times 
	for (int i=0; i<3*numTriangles_; ++i) {
		Vector4D posObj(positionData_[i].x, positionData_[i].y, positionData_[i].z, 1.f);
		Vector4D posObjWorld = getObjectToWorld() * posObj;
		bbox.expand(posObjWorld.projectTo3D());
  	}

  	return bbox;
}